

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampbuf.c
# Opt level: O3

sample_t_conflict ** create_sample_buffer(int n_channels,int32 length)

{
  sample_t_conflict **__ptr;
  sample_t_conflict *psVar1;
  ulong uVar2;
  
  __ptr = (sample_t_conflict **)malloc((long)n_channels << 3);
  if (__ptr != (sample_t_conflict **)0x0) {
    psVar1 = (sample_t_conflict *)malloc((long)(length * n_channels) << 2);
    *__ptr = psVar1;
    if (psVar1 != (sample_t_conflict *)0x0) {
      if (n_channels < 2) {
        return __ptr;
      }
      psVar1 = *__ptr;
      uVar2 = 1;
      do {
        psVar1 = psVar1 + length;
        __ptr[uVar2] = psVar1;
        uVar2 = uVar2 + 1;
      } while ((uint)n_channels != uVar2);
      return __ptr;
    }
    free(__ptr);
  }
  return (sample_t_conflict **)0x0;
}

Assistant:

sample_t **create_sample_buffer(int n_channels, int32 length)
{
	int i;
	sample_t **samples = malloc(n_channels * sizeof(*samples));
	if (!samples) return NULL;
	samples[0] = malloc(n_channels * length * sizeof(*samples[0]));
	if (!samples[0]) {
		free(samples);
		return NULL;
	}
	for (i = 1; i < n_channels; i++) samples[i] = samples[i-1] + length;
	return samples;
}